

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

int __thiscall ON_4fPoint::MaximumCoordinateIndex(ON_4fPoint *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(ABS(this->x) < ABS(this->y));
  uVar3 = 2;
  if (ABS(this->z) <= ABS((&this->x)[uVar2])) {
    uVar3 = uVar2;
  }
  iVar1 = 3;
  if (ABS(this->w) <= ABS((&this->x)[uVar3])) {
    iVar1 = (int)uVar3;
  }
  return iVar1;
}

Assistant:

int ON_4fPoint::MaximumCoordinateIndex() const
{
  const float* a = &x;
  int i = ( fabs(y) > fabs(x) ) ? 1 : 0;
  if (fabs(z) > fabs(a[i])) i = 2; if (fabs(w) > fabs(a[i])) i = 3;
  return i;
}